

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.hpp
# Opt level: O0

size_t tf::floor_log2<unsigned_long>(unsigned_long n)

{
  long lVar1;
  unsigned_long n_local;
  
  lVar1 = 0x3f;
  if (n != 0) {
    for (; n >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  return (long)(int)(0x3f - ((uint)lVar1 ^ 0x3f));
}

Assistant:

constexpr size_t floor_log2(T n) {

   static_assert(std::is_unsigned_v<T>, "log2 only supports unsigned integer types");

#if defined(_MSC_VER)
  unsigned long index;
  if constexpr (sizeof(T) == 8) {
    _BitScanReverse64(&index, n);
  } else {
    _BitScanReverse(&index, static_cast<unsigned long>(n));
  }
  return static_cast<size_t>(index);
#elif defined(__GNUC__) || defined(__clang__)
  if constexpr (sizeof(T) == 8) {
    return 63 - __builtin_clzll(n);
  } else {
    return 31 - __builtin_clz(n);
  }
#else
  // Portable fallback: Uses bit shifts to count leading zeros manually
  size_t log = 0;
  while (n >>= 1) {
    ++log;
  }
  return log;
#endif
}